

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_wrap_encoding_transform.h
# Opt level: O2

void __thiscall
draco::PredictionSchemeWrapEncodingTransform<int,_int>::Init
          (PredictionSchemeWrapEncodingTransform<int,_int> *this,int *orig_data,int size,
          int num_components)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  PredictionSchemeWrapTransformBase<int>::Init
            (&this->super_PredictionSchemeWrapTransformBase<int>,num_components);
  if (size != 0) {
    iVar3 = *orig_data;
    iVar5 = iVar3;
    for (lVar4 = 1; lVar4 < size; lVar4 = lVar4 + 1) {
      iVar1 = orig_data[lVar4];
      iVar2 = iVar5;
      if (iVar5 < iVar1) {
        iVar2 = iVar1;
      }
      if (iVar3 <= iVar1) {
        iVar5 = iVar2;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
    }
    (this->super_PredictionSchemeWrapTransformBase<int>).min_value_ = iVar3;
    (this->super_PredictionSchemeWrapTransformBase<int>).max_value_ = iVar5;
    PredictionSchemeWrapTransformBase<int>::InitCorrectionBounds
              (&this->super_PredictionSchemeWrapTransformBase<int>);
    return;
  }
  return;
}

Assistant:

void Init(const DataTypeT *orig_data, int size, int num_components) {
    PredictionSchemeWrapTransformBase<DataTypeT>::Init(num_components);
    // Go over the original values and compute the bounds.
    if (size == 0) {
      return;
    }
    DataTypeT min_value = orig_data[0];
    DataTypeT max_value = min_value;
    for (int i = 1; i < size; ++i) {
      if (orig_data[i] < min_value) {
        min_value = orig_data[i];
      } else if (orig_data[i] > max_value) {
        max_value = orig_data[i];
      }
    }
    this->set_min_value(min_value);
    this->set_max_value(max_value);
    this->InitCorrectionBounds();
  }